

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall CLIntercept::dumpProgramBinary(CLIntercept *this,cl_program program)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  int iVar7;
  cl_int cVar8;
  mapped_type *pmVar9;
  long lVar10;
  void *__s;
  void *pvVar11;
  long *plVar12;
  undefined8 uVar13;
  long *plVar14;
  size_t __n;
  ulong uVar15;
  ulong uVar16;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar18;
  size_t numDevices;
  cl_device_type deviceType;
  string fileName;
  char numberString [256];
  size_t local_1c8;
  ulong local_1c0;
  cl_program local_1b8;
  void *local_1b0;
  void *local_1a8;
  pthread_mutex_t *local_1a0;
  string local_198;
  long *local_178;
  long local_170;
  long local_168;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [8];
  
  local_1b8 = program;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar7 == 0) {
    local_1a0 = (pthread_mutex_t *)&this->m_Mutex;
    pmVar9 = std::
             map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
             ::operator[](&this->m_ProgramInfoMap,&local_1b8);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    local_198._M_string_length = 0;
    local_198.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)local_138,sc_DumpDirectoryName,(allocator *)&local_178);
    OS::Services_Common::GetDumpDirectoryName
              (&(this->m_OS).super_Services_Common,local_138,&local_198);
    paVar1 = &local_138[0].field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_138[0]._M_dataplus._M_p);
    }
    memset(local_138,0,0x100);
    if ((this->m_Config).OmitProgramNumber == true) {
      uVar2 = pmVar9->CompileCount;
      uVar3 = (uint)pmVar9->ProgramHash;
      uVar4 = (uint)pmVar9->OptionsHash;
      pcVar5 = "$%08X_%04u_%08X";
    }
    else {
      uVar2 = (uint)pmVar9->ProgramHash;
      uVar3 = pmVar9->ProgramNumber;
      uVar4 = pmVar9->CompileCount;
      pcVar5 = "$%04u_%08X_%04u_%08X";
    }
    snprintf((char *)local_138,0x100,pcVar5 + 1,(ulong)uVar3,(ulong)uVar2,(ulong)uVar4);
    std::__cxx11::string::append((char *)&local_198);
    std::__cxx11::string::append((char *)&local_198);
    lVar10 = std::__cxx11::string::find((char *)&local_198,0x19d01b,0);
    lVar10 = std::__cxx11::string::find((char *)&local_198,0x19d01b,lVar10 + 1);
    if (lVar10 != -1) {
      do {
        std::__cxx11::string::substr((ulong)local_138,(ulong)&local_198);
        mkdir(local_138[0]._M_dataplus._M_p,0x1ff);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_138[0]._M_dataplus._M_p);
        }
        lVar10 = std::__cxx11::string::find((char *)&local_198,0x19d01b,lVar10 + 1);
      } while (lVar10 != -1);
    }
    local_1c8 = 0;
    cVar8 = (*(this->m_Dispatch).clGetProgramInfo)(local_1b8,0x1163,0,(void *)0x0,&local_1c8);
    sVar6 = local_1c8;
    if (cVar8 == 0) {
      __n = local_1c8 & 0xfffffffffffffff8;
      local_1c8 = local_1c8 >> 3;
      local_1a8 = operator_new__(__n);
      __s = operator_new__(__n);
      local_1b0 = operator_new__(__n);
      if (sVar6 < 8) {
        __n = 0;
      }
      else {
        memset(__s,0,__n);
      }
      cVar8 = (*(this->m_Dispatch).clGetProgramInfo)(local_1b8,0x1163,__n,local_1a8,(size_t *)0x0);
      if (cVar8 == 0) {
        cVar8 = (*(this->m_Dispatch).clGetProgramInfo)
                          (local_1b8,0x1165,local_1c8 << 3,local_1b0,(size_t *)0x0);
        sVar6 = local_1c8;
        if (cVar8 == 0) {
          if (local_1c8 != 0) {
            uVar16 = 0;
            do {
              pvVar11 = operator_new__(*(ulong *)((long)local_1b0 + uVar16 * 8));
              *(void **)((long)__s + uVar16 * 8) = pvVar11;
              uVar16 = uVar16 + 1;
            } while (sVar6 != uVar16);
          }
          cVar8 = (*(this->m_Dispatch).clGetProgramInfo)
                            (local_1b8,0x1166,sVar6 << 3,__s,(size_t *)0x0);
          if (local_1c8 != 0 && cVar8 == 0) {
            uVar16 = 0;
            do {
              local_1c0 = 1;
              (*(this->m_Dispatch).clGetDeviceInfo)
                        (*(cl_device_id *)((long)local_1a8 + uVar16 * 8),0x1000,8,&local_1c0,
                         (size_t *)0x0);
              local_138[0]._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_138,local_198._M_dataplus._M_p,
                         local_198._M_dataplus._M_p + local_198._M_string_length);
              if ((local_1c0 & 2) != 0) {
                std::__cxx11::string::append((char *)local_138);
              }
              if ((local_1c0 & 4) != 0) {
                std::__cxx11::string::append((char *)local_138);
              }
              if ((local_1c0 & 8) != 0) {
                std::__cxx11::string::append((char *)local_138);
              }
              if ((local_1c0 & 0x10) != 0) {
                std::__cxx11::string::append((char *)local_138);
              }
              std::__cxx11::string::append((char *)local_138);
              std::operator+(&local_158,"Dumping program binary to file: ",local_138);
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_158);
              local_178 = &local_168;
              plVar14 = plVar12 + 2;
              if ((long *)*plVar12 == plVar14) {
                uVar17 = (undefined4)*plVar14;
                uVar18 = *(undefined4 *)((long)plVar12 + 0x14);
                local_168 = *plVar14;
                uStack_160 = (undefined4)plVar12[3];
                uStack_15c = *(undefined4 *)((long)plVar12 + 0x1c);
              }
              else {
                local_168 = *plVar14;
                uVar17 = extraout_XMM0_Da;
                uVar18 = extraout_XMM0_Db;
                local_178 = (long *)*plVar12;
              }
              local_170 = plVar12[1];
              *plVar12 = (long)plVar14;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              log(this,(double)CONCAT44(uVar18,uVar17));
              if (local_178 != &local_168) {
                operator_delete(local_178);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p);
              }
              dumpMemoryToFile(this,local_138,false,*(void **)((long)__s + uVar16 * 8),
                               *(size_t *)((long)local_1b0 + uVar16 * 8));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138[0]._M_dataplus._M_p != paVar1) {
                operator_delete(local_138[0]._M_dataplus._M_p);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 < local_1c8);
          }
          if (local_1c8 != 0) {
            uVar15 = 0;
            uVar16 = local_1c8;
            do {
              pvVar11 = *(void **)((long)__s + uVar15 * 8);
              if (pvVar11 != (void *)0x0) {
                operator_delete__(pvVar11);
                uVar16 = local_1c8;
              }
              *(undefined8 *)((long)__s + uVar15 * 8) = 0;
              uVar15 = uVar15 + 1;
            } while (uVar15 < uVar16);
          }
        }
      }
      operator_delete__(local_1a8);
      operator_delete__(__s);
      operator_delete__(local_1b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    pthread_mutex_unlock(local_1a0);
    return;
  }
  uVar13 = std::__throw_system_error(iVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  pthread_mutex_unlock(local_1a0);
  _Unwind_Resume(uVar13);
}

Assistant:

void CLIntercept::dumpProgramBinary(
    const cl_program program )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

    std::string     fileName;

    // Get the dump directory name.
    {
        OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
    }
    // Make the file name.  It will have the form:
    //   CLI_<program number>_<program hash>_<compile count>_<options hash>
    // Leave off the extension for now.
    {
        char    numberString[256] = "";

        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X_%04u_%08X",
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X_%04u_%08X",
                programInfo.ProgramNumber,
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }

        fileName += "/CLI_";
        fileName += numberString;
    }
    // Now make directories as appropriate.
    {
        OS().MakeDumpDirectories( fileName );
    }

    cl_int  errorCode = CL_SUCCESS;

    size_t  numDevices = 0;

    if( errorCode == CL_SUCCESS )
    {
        // Get all of the devices associated with this program.
        errorCode = dispatch().clGetProgramInfo(
            program,
            CL_PROGRAM_DEVICES,
            0,
            NULL,
            &numDevices );
    }

    cl_device_id*   devices = NULL;
    char**          programBinaries = NULL;
    size_t*         programBinarySizes = NULL;

    if( errorCode == CL_SUCCESS )
    {
        numDevices /= sizeof( cl_device_id );

        devices = new cl_device_id[ numDevices ];
        programBinaries = new char*[ numDevices ];
        programBinarySizes = new size_t[ numDevices ];

        if( ( devices == NULL ) ||
            ( programBinaries == NULL ) ||
            ( programBinarySizes == NULL ) )
        {
            CLI_ASSERT( 0 );
            errorCode = CL_OUT_OF_HOST_MEMORY;
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        for( size_t i = 0; i < numDevices; i++ )
        {
            programBinaries[i] = NULL;
        }

        errorCode = dispatch().clGetProgramInfo(
            program,
            CL_PROGRAM_DEVICES,
            numDevices * sizeof( cl_device_id ),
            devices,
            NULL );
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetProgramInfo(
            program,
            CL_PROGRAM_BINARY_SIZES,
            numDevices * sizeof( size_t ),
            programBinarySizes,
            NULL );
    }

    if( errorCode == CL_SUCCESS )
    {
        for( size_t i = 0; i < numDevices; i++ )
        {
            programBinaries[ i ] = new char[ programBinarySizes[ i ] ];
            if( programBinaries[ i ] == NULL )
            {
                errorCode = CL_OUT_OF_HOST_MEMORY;
                break;
            }
        }

        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clGetProgramInfo(
                program,
                CL_PROGRAM_BINARIES,
                numDevices * sizeof( char* ),
                programBinaries,
                NULL );
        }

        if( errorCode == CL_SUCCESS )
        {
            for( size_t i = 0; i < numDevices; i++ )
            {
                cl_device_type  deviceType = CL_DEVICE_TYPE_DEFAULT;

                // It's OK if this fails.  If it does, it just
                // means that our output file won't have a device
                // type.
                dispatch().clGetDeviceInfo(
                    devices[ i ],
                    CL_DEVICE_TYPE,
                    sizeof( deviceType ),
                    &deviceType,
                    NULL );

                std::string outputFileName = fileName;

                if( deviceType & CL_DEVICE_TYPE_CPU )
                {
                    outputFileName += "_CPU";
                }
                if( deviceType & CL_DEVICE_TYPE_GPU )
                {
                    outputFileName += "_GPU";
                }
                if( deviceType & CL_DEVICE_TYPE_ACCELERATOR )
                {
                    outputFileName += "_ACC";
                }
                if( deviceType & CL_DEVICE_TYPE_CUSTOM )
                {
                    outputFileName += "_CUSTOM";
                }

                outputFileName += ".bin";

                log( "Dumping program binary to file: " + outputFileName + "\n" );
                dumpMemoryToFile(
                    outputFileName,
                    false,
                    programBinaries[ i ],
                    programBinarySizes[ i ] );
            }
        }

        for( size_t i = 0; i < numDevices; i++ )
        {
            delete [] programBinaries[ i ];
            programBinaries[ i ] = NULL;
        }
    }

    delete [] devices;
    devices = NULL;

    delete [] programBinaries;
    programBinaries = NULL;

    delete [] programBinarySizes;
    programBinarySizes = NULL;
}